

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O1

void __thiscall kj::Vector<kj::OwnFd>::setCapacity(Vector<kj::OwnFd> *this,size_t newSize)

{
  OwnFd *pOVar1;
  RemoveConst<kj::OwnFd> *pRVar2;
  OwnFd *pOVar3;
  ArrayBuilder<kj::OwnFd> newBuilder;
  ArrayBuilder<kj::OwnFd> local_38;
  
  pOVar1 = (this->builder).ptr;
  pOVar3 = (this->builder).pos;
  if (newSize < (ulong)((long)pOVar3 - (long)pOVar1 >> 2)) {
    while (pOVar1 + newSize < pOVar3) {
      (this->builder).pos = pOVar3 + -1;
      OwnFd::~OwnFd(pOVar3 + -1);
      pOVar3 = (this->builder).pos;
    }
  }
  local_38.ptr = (OwnFd *)kj::_::HeapArrayDisposer::allocateImpl
                                    (4,0,newSize,(_func_void_void_ptr *)0x0,
                                     (_func_void_void_ptr *)0x0);
  local_38.endPtr = local_38.ptr + newSize;
  local_38.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  pOVar3 = (this->builder).pos;
  local_38.pos = local_38.ptr;
  for (pOVar1 = (this->builder).ptr; pOVar1 != pOVar3; pOVar1 = pOVar1 + 1) {
    (local_38.pos)->fd = pOVar1->fd;
    pOVar1->fd = -1;
    local_38.pos = local_38.pos + 1;
  }
  ArrayBuilder<kj::OwnFd>::operator=(&this->builder,&local_38);
  pOVar3 = local_38.endPtr;
  pRVar2 = local_38.pos;
  pOVar1 = local_38.ptr;
  if (local_38.ptr != (OwnFd *)0x0) {
    local_38.ptr = (OwnFd *)0x0;
    local_38.pos = (RemoveConst<kj::OwnFd> *)0x0;
    local_38.endPtr = (OwnFd *)0x0;
    (**(local_38.disposer)->_vptr_ArrayDisposer)
              (local_38.disposer,pOVar1,4,(long)pRVar2 - (long)pOVar1 >> 2,
               (long)pOVar3 - (long)pOVar1 >> 2,ArrayDisposer::Dispose_<kj::OwnFd>::destruct);
  }
  return;
}

Assistant:

void setCapacity(size_t newSize) {
    if (builder.size() > newSize) {
      builder.truncate(newSize);
    }
    ArrayBuilder<T> newBuilder = heapArrayBuilder<T>(newSize);
    newBuilder.addAll(kj::mv(builder));
    builder = kj::mv(newBuilder);
  }